

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O2

void vrna_md_defaults_temperature(double T)

{
  if (T < -273.15) {
    vrna_message_warning
              (
              "vrna_md_defaults_temperature@model.c: Temperature out of range, T must be above absolute zero. Not changing anything!"
              );
    return;
  }
  defaults.temperature = T;
  temperature = T;
  return;
}

Assistant:

PUBLIC void
vrna_md_defaults_temperature(double T)
{
  if (T >= -K0) {
    defaults.temperature = T;
#ifndef VRNA_DISABLE_BACKWARD_COMPATIBILITY
    temperature = T;
#endif
  } else {
    vrna_message_warning(
      "vrna_md_defaults_temperature@model.c: Temperature out of range, T must be above absolute zero. Not changing anything!");
  }
}